

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O2

int lj_cf_debug_traceback(lua_State *L)

{
  int32_t level;
  undefined8 in_RAX;
  lua_State *L1;
  char *msg;
  int arg;
  
  arg = (int)((ulong)in_RAX >> 0x20);
  L1 = getthread(L,&arg);
  msg = lua_tolstring(L,arg + 1,(size_t *)0x0);
  if ((msg == (char *)0x0) && (L->base + arg < L->top)) {
    L->top = L->base + arg + 1;
  }
  else {
    level = lj_lib_optint(L,arg + 2,(uint)(L1 == L));
    luaL_traceback(L,L1,msg,level);
  }
  return 1;
}

Assistant:

LJLIB_CF(debug_traceback)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  const char *msg = lua_tostring(L, arg+1);
  if (msg == NULL && L->top > L->base+arg)
    L->top = L->base+arg+1;
  else
    luaL_traceback(L, L1, msg, lj_lib_optint(L, arg+2, (L == L1)));
  return 1;
}